

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

void __thiscall
QDomEntityPrivate::QDomEntityPrivate
          (QDomEntityPrivate *this,QDomDocumentPrivate *d,QDomNodePrivate *parent,QString *aname,
          QString *pub,QString *sys,QString *notation)

{
  QDomNodePrivate *in_RCX;
  undefined8 *in_RDI;
  QDomDocumentPrivate *in_R8;
  QDomNodePrivate *in_R9;
  
  QDomNodePrivate::QDomNodePrivate(in_RCX,in_R8,in_R9);
  *in_RDI = &PTR__QDomEntityPrivate_001463b0;
  QString::QString((QString *)0x1193c1);
  QString::QString((QString *)0x1193d1);
  QString::QString((QString *)0x1193e1);
  QString::operator=((QString *)(in_RDI + 7),(QString *)in_RCX);
  QString::operator=((QString *)(in_RDI + 0x18),(QString *)in_R8);
  QString::operator=((QString *)(in_RDI + 0x15),(QString *)in_R9);
  QString::operator=((QString *)(in_RDI + 0x1b),(QString *)sys);
  return;
}

Assistant:

QDomEntityPrivate::QDomEntityPrivate(QDomDocumentPrivate* d, QDomNodePrivate* parent,
                                        const QString& aname,
                                        const QString& pub, const QString& sys, const QString& notation)
    : QDomNodePrivate(d, parent)
{
    name = aname;
    m_pub = pub;
    m_sys = sys;
    m_notationName = notation;
}